

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  ImGuiID IVar1;
  ImGuiID id;
  char *unaff_retaddr;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd8;
  ImGuiWindow *this;
  
  this = GImGui->CurrentWindow;
  IVar1 = ImGuiWindow::GetID((ImGuiWindow *)g,(char *)window,unaff_retaddr);
  ImVector<unsigned_int>::push_back
            ((ImVector<unsigned_int> *)this,(uint *)CONCAT44(IVar1,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(str_id_begin, str_id_end);
    window->IDStack.push_back(id);
}